

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_b64encode.c
# Opt level: O0

wchar_t archive_filter_b64encode_options(archive_write_filter *f,char *key,char *value)

{
  int iVar1;
  size_t char_cnt;
  int64_t iVar2;
  archive_string *in_RDX;
  char *in_RSI;
  long in_RDI;
  private_b64encode *state;
  size_t in_stack_ffffffffffffffd0;
  uint *_p;
  wchar_t local_4;
  
  _p = *(uint **)(in_RDI + 0x40);
  iVar1 = strcmp(in_RSI,"mode");
  if (iVar1 == 0) {
    if (in_RDX == (archive_string *)0x0) {
      archive_set_error(*(archive **)(in_RDI + 8),-1,"mode option requires octal digits");
      local_4 = L'\xffffffe7';
    }
    else {
      char_cnt = strlen((char *)in_RDX);
      iVar2 = atol8((char *)in_RDX,char_cnt);
      *_p = (uint)iVar2 & 0x1ff;
      local_4 = L'\0';
    }
  }
  else {
    iVar1 = strcmp(in_RSI,"name");
    if (iVar1 == 0) {
      if (in_RDX == (archive_string *)0x0) {
        archive_set_error(*(archive **)(in_RDI + 8),-1,"name option requires a string");
        local_4 = L'\xffffffe7';
      }
      else {
        _p[4] = 0;
        _p[5] = 0;
        if (in_RDX != (archive_string *)0x0) {
          strlen((char *)in_RDX);
        }
        archive_strncat(in_RDX,_p,in_stack_ffffffffffffffd0);
        local_4 = L'\0';
      }
    }
    else {
      local_4 = L'\xffffffec';
    }
  }
  return local_4;
}

Assistant:

static int
archive_filter_b64encode_options(struct archive_write_filter *f, const char *key,
    const char *value)
{
	struct private_b64encode *state = (struct private_b64encode *)f->data;

	if (strcmp(key, "mode") == 0) {
		if (value == NULL) {
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "mode option requires octal digits");
			return (ARCHIVE_FAILED);
		}
		state->mode = (int)atol8(value, strlen(value)) & 0777;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "name") == 0) {
		if (value == NULL) {
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "name option requires a string");
			return (ARCHIVE_FAILED);
		}
		archive_strcpy(&state->name, value);
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}